

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.h
# Opt level: O2

void __thiscall
Js::PropertyDescriptor::PropertyDescriptor(PropertyDescriptor *this,PropertyDescriptor *other)

{
  Type TVar1;
  Type TVar2;
  Type TVar3;
  Type TVar4;
  Type TVar5;
  Type TVar6;
  Type TVar7;
  
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->Value,(other->Value).ptr);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->Getter,(other->Getter).ptr);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->Setter,(other->Setter).ptr);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->originalVar,(other->originalVar).ptr);
  TVar1 = other->enumerableSpecified;
  TVar2 = other->configurableSpecified;
  TVar3 = other->valueSpecified;
  TVar4 = other->getterSpecified;
  TVar5 = other->setterSpecified;
  TVar6 = other->Writable;
  TVar7 = other->Enumerable;
  this->writableSpecified = other->writableSpecified;
  this->enumerableSpecified = TVar1;
  this->configurableSpecified = TVar2;
  this->valueSpecified = TVar3;
  this->getterSpecified = TVar4;
  this->setterSpecified = TVar5;
  this->Writable = TVar6;
  this->Enumerable = TVar7;
  this->Configurable = other->Configurable;
  this->fromProxy = other->fromProxy;
  return;
}

Assistant:

PropertyDescriptor(const PropertyDescriptor& other)
            :Value(other.Value),
            Getter(other.Getter),
            Setter(other.Setter),
            originalVar(other.originalVar),
            writableSpecified(other.writableSpecified),
            enumerableSpecified(other.enumerableSpecified),
            configurableSpecified(other.configurableSpecified),
            valueSpecified(other.valueSpecified),
            getterSpecified(other.getterSpecified),
            setterSpecified(other.setterSpecified),
            Writable(other.Writable),
            Enumerable(other.Enumerable),
            Configurable(other.Configurable),
            fromProxy(other.fromProxy)
        {
        }